

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SerializedModel::SerializeWithCachedSizes
          (SerializedModel *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  psVar1 = (this->identifier_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.SerializedModel.identifier");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->identifier_).ptr_,output);
  }
  psVar1 = (this->model_).ptr_;
  if (psVar1->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(2,psVar1,output);
    return;
  }
  return;
}

Assistant:

void SerializedModel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SerializedModel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string identifier = 1;
  if (this->identifier().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->identifier().data(), this->identifier().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.SerializedModel.identifier");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->identifier(), output);
  }

  // bytes model = 2;
  if (this->model().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      2, this->model(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SerializedModel)
}